

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarray.c
# Opt level: O0

void tommy_array_init(tommy_array *array)

{
  long lVar1;
  void **ppvVar2;
  long in_FS_OFFSET;
  uint local_1c;
  tommy_uint_t i;
  tommy_array *array_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  array->bucket_bit = 6;
  array->bucket_max = 1 << ((byte)array->bucket_bit & 0x1f);
  ppvVar2 = (void **)lrtr_calloc((ulong)array->bucket_max,8);
  array->bucket[0] = ppvVar2;
  for (local_1c = 1; local_1c < 6; local_1c = local_1c + 1) {
    array->bucket[local_1c] = array->bucket[0];
  }
  array->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_array_init(tommy_array* array)
{
	tommy_uint_t i;

	/* fixed initial size */
	array->bucket_bit = TOMMY_ARRAY_BIT;
	array->bucket_max = 1 << array->bucket_bit;
	array->bucket[0] = tommy_cast(void**, tommy_calloc(array->bucket_max, sizeof(void*)));
	for (i = 1; i < TOMMY_ARRAY_BIT; ++i)
		array->bucket[i] = array->bucket[0];

	array->count = 0;
}